

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_2_integer(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_intf(&G->data,PVIP_NODE_INT,yytext,(long)yyleng,10);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_integer(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define i G->val[-1]
  yyprintf((stderr, "do yy_2_integer"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
    yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, 10);\n\
}\n"));
  
    yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, 10);
;
#undef i
}